

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall slang::ast::DefParamVisitor::~DefParamVisitor(DefParamVisitor *this)

{
  boost::unordered::
  unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ::~unordered_flat_set
            ((unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              *)0x3695ac);
  SmallVector<const_slang::ast::DefParamSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::DefParamSymbol_*,_5UL> *)0x3695b6);
  return;
}

Assistant:

DefParamVisitor(size_t maxInstanceDepth, size_t generateLevel) :
        maxInstanceDepth(maxInstanceDepth), generateLevel(generateLevel) {}